

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

gdIOCtx * gdNewDynamicCtxEx(int initialSize,void *data,int freeOKFlag)

{
  dynamicPtr *pdVar1;
  dynamicPtr *dp;
  dpIOCtx *ctx;
  int freeOKFlag_local;
  void *data_local;
  gdIOCtx *pgStack_10;
  int initialSize_local;
  
  pgStack_10 = (gdIOCtx *)gdMalloc(0x48);
  if (pgStack_10 == (gdIOCtx *)0x0) {
    pgStack_10 = (gdIOCtx *)0x0;
  }
  else {
    pdVar1 = newDynamic(initialSize,data,freeOKFlag);
    if (pdVar1 == (dynamicPtr *)0x0) {
      gdFree(pgStack_10);
      pgStack_10 = (gdIOCtx *)0x0;
    }
    else {
      pgStack_10[1].getC = (_func_int_gdIOCtx_ptr *)pdVar1;
      pgStack_10->getC = dynamicGetchar;
      pgStack_10->putC = dynamicPutchar;
      pgStack_10->getBuf = dynamicGetbuf;
      pgStack_10->putBuf = dynamicPutbuf;
      pgStack_10->seek = dynamicSeek;
      pgStack_10->tell = dynamicTell;
      pgStack_10->gd_free = gdFreeDynamicCtx;
    }
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewDynamicCtxEx(int initialSize, void *data, int freeOKFlag)
{
	dpIOCtx *ctx;
	dynamicPtr *dp;

	ctx = (dpIOCtx *)gdMalloc(sizeof (dpIOCtx));
	if(ctx == NULL) {
		return NULL;
	}

	dp = newDynamic(initialSize, data, freeOKFlag);
	if(!dp) {
		gdFree (ctx);
		return NULL;
	};

	ctx->dp = dp;

	ctx->ctx.getC = dynamicGetchar;
	ctx->ctx.putC = dynamicPutchar;

	ctx->ctx.getBuf = dynamicGetbuf;
	ctx->ctx.putBuf = dynamicPutbuf;

	ctx->ctx.seek = dynamicSeek;
	ctx->ctx.tell = dynamicTell;

	ctx->ctx.gd_free = gdFreeDynamicCtx;

	return (gdIOCtx *)ctx;
}